

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glApi.cpp
# Opt level: O2

void __thiscall Sampler::Sampler(Sampler *this,int texUnit)

{
  ostream *poVar1;
  
  (this->super_OGLStateObject)._vptr_OGLStateObject = (_func_int **)&PTR_bind_001a94d8;
  this->m_location = 0;
  this->m_texUnit = texUnit;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Failure in file ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/glApi.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0xd3);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Sampler::Sampler(int)");
  poVar1 = std::operator<<(poVar1,
                           ": You must complete the implementation (look at the documentation in the header)"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

Sampler::Sampler(int texUnit) : m_location(0), m_texUnit(texUnit)
{
  FAIL_BECAUSE_INCOMPLETE;
}